

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::FormattingScene::Transform(FormattingScene *this,Float *transform,FileLoc loc)

{
  long lVar1;
  string sStack_38;
  
  indent_abi_cxx11_(&sStack_38,this,0);
  Printf<std::__cxx11::string>("%sTransform [ ",&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 4) {
    Printf<float&>("%f ",(float *)((long)transform + lVar1));
  }
  Printf<>(" ]\n");
  return;
}

Assistant:

void FormattingScene::Transform(Float transform[16], FileLoc loc) {
    Printf("%sTransform [ ", indent());
    for (int i = 0; i < 16; ++i)
        Printf("%f ", transform[i]);
    Printf(" ]\n");
}